

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  AcceptOnPropertyExprSyntax *pAVar1;
  Token *unaff_retaddr;
  ExpressionSyntax *in_stack_00000008;
  Token *in_stack_00000010;
  Token *in_stack_00000018;
  BumpAllocator *in_stack_00000020;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x795fa0);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)__child_stack,in_stack_ffffffffffffffa8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  not_null<slang::syntax::PropertyExprSyntax_*>::operator*
            ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x795fdd);
  deepClone<slang::syntax::PropertyExprSyntax>
            ((PropertyExprSyntax *)__child_stack,in_stack_ffffffffffffffa8);
  pAVar1 = BumpAllocator::
           emplace<slang::syntax::AcceptOnPropertyExprSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::PropertyExprSyntax&>
                     (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                      unaff_retaddr,(PropertyExprSyntax *)__fn);
  return (int)pAVar1;
}

Assistant:

static SyntaxNode* clone(const AcceptOnPropertyExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<AcceptOnPropertyExprSyntax>(
        node.keyword.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.condition, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone<PropertyExprSyntax>(*node.expr, alloc)
    );
}